

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

peer_info * __thiscall
nuraft::raft_server::get_peer_info(peer_info *__return_storage_ptr__,raft_server *this,int32 srv_id)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Hash_node_base *p_Var3;
  uint64_t uVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  unique_lock<std::recursive_mutex> guard;
  unique_lock<std::recursive_mutex> local_30;
  
  if (((this->leader_).super___atomic_base<int>._M_i == this->id_) && ((this->role_)._M_i == leader)
     ) {
    local_30._M_device = &this->lock_;
    local_30._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_30);
    local_30._M_owns = true;
    uVar1 = (this->peers_)._M_h._M_bucket_count;
    uVar5 = (ulong)(long)srv_id % uVar1;
    p_Var6 = (this->peers_)._M_h._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(int *)&p_Var6->_M_nxt[1]._M_nxt != srv_id)) {
      while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var7 = p_Var6, *(int *)&p_Var3[1]._M_nxt == srv_id)) goto LAB_001fcc16;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_001fcc16:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var7->_M_nxt;
    }
    __return_storage_ptr__->id_ = -1;
    __return_storage_ptr__->last_log_idx_ = 0;
    __return_storage_ptr__->last_succ_resp_us_ = 0;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      p_Var2 = p_Var3[2]._M_nxt;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3[3]._M_nxt;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      __return_storage_ptr__->id_ = *(int32 *)&p_Var2->_M_nxt->_M_nxt;
      __return_storage_ptr__->last_log_idx_ = (ulong)p_Var2[0xe]._M_nxt;
      uVar4 = timer_helper::get_us((timer_helper *)(p_Var2 + 0x28));
      __return_storage_ptr__->last_succ_resp_us_ = uVar4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  }
  else {
    __return_storage_ptr__->id_ = -1;
    __return_storage_ptr__->last_log_idx_ = 0;
    __return_storage_ptr__->last_succ_resp_us_ = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

raft_server::peer_info raft_server::get_peer_info(int32 srv_id) const {
    if (!is_leader()) return peer_info();

    recur_lock(lock_);
    auto entry = peers_.find(srv_id);
    if (entry == peers_.end()) return peer_info();

    peer_info ret;
    ptr<peer> pp = entry->second;
    ret.id_ = pp->get_id();
    ret.last_log_idx_ = pp->get_last_accepted_log_idx();
    ret.last_succ_resp_us_ = pp->get_resp_timer_us();
    return ret;
}